

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O0

Aig_Man_t * Aig_ManExtractMiter(Aig_Man_t *p,Aig_Obj_t *pNode1,Aig_Obj_t *pNode2)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  Aig_Man_t *p_00;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Aig_Obj_t *pNode2_local;
  Aig_Obj_t *pNode1_local;
  Aig_Man_t *p_local;
  
  iVar2 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar2);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Aig_ManCleanData(p);
  pAVar5 = Aig_ManConst1(p_00);
  pAVar6 = Aig_ManConst1(p);
  (pAVar6->field_5).pData = pAVar5;
  for (local_34 = 0; iVar2 = Vec_PtrSize(p->vCis), local_34 < iVar2; local_34 = local_34 + 1) {
    pvVar7 = Vec_PtrEntry(p->vCis,local_34);
    pAVar5 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  Aig_ManDup_rec(p_00,p,pNode1);
  Aig_ManDup_rec(p_00,p,pNode2);
  pAVar5 = Aig_Exor(p_00,(Aig_Obj_t *)(pNode1->field_5).pData,(Aig_Obj_t *)(pNode2->field_5).pData);
  pAVar6 = Aig_Regular(pAVar5);
  uVar1 = *(ulong *)&pAVar6->field_0x18;
  uVar3 = Aig_IsComplement(pAVar5);
  pAVar5 = Aig_NotCond(pAVar5,(uint)(uVar1 >> 3) & 1 ^ uVar3);
  Aig_ObjCreateCo(p_00,pAVar5);
  iVar2 = Aig_ManCheck(p_00);
  if (iVar2 == 0) {
    printf("Aig_ManExtractMiter(): The check has failed.\n");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManExtractMiter( Aig_Man_t * p, Aig_Obj_t * pNode1, Aig_Obj_t * pNode2 )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
    // dump the nodes
    Aig_ManDup_rec( pNew, p, pNode1 );   
    Aig_ManDup_rec( pNew, p, pNode2 );   
    // construct the EXOR
    pObj = Aig_Exor( pNew, (Aig_Obj_t *)pNode1->pData, (Aig_Obj_t *)pNode2->pData ); 
    pObj = Aig_NotCond( pObj, Aig_Regular(pObj)->fPhase ^ Aig_IsComplement(pObj) );
    // add the PO
    Aig_ObjCreateCo( pNew, pObj );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManExtractMiter(): The check has failed.\n" );
    return pNew;
}